

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::NameShadowingChecker::loadBindings(NameShadowingChecker *this,HSQOBJECT *bindings)

{
  SQObjectValue info_00;
  NameShadowingChecker *in_RSI;
  undefined8 in_RDI;
  SymbolInfo *info;
  SQChar *s;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr pos;
  SQInteger idx;
  SQTable *table;
  SQObjectPtr *in_stack_ffffffffffffff80;
  NameShadowingChecker *in_stack_ffffffffffffff90;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQObjectPtr *in_stack_ffffffffffffffa0;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb7;
  SQTable *in_stack_ffffffffffffffb8;
  int local_40;
  long local_38;
  SQObjectPtr local_30;
  SQChar *name;
  
  if ((in_RSI != (NameShadowingChecker *)0x0) &&
     (*(int *)&(in_RSI->super_Visitor)._vptr_Visitor == 0xa000020)) {
    name = (in_RSI->_ctx)._sourceName;
    ::SQObjectPtr::SQObjectPtr(&local_30,0);
    ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff80);
    ::SQObjectPtr::SQObjectPtr(in_stack_ffffffffffffff80);
    info_00 = local_30.super_SQObject._unVal;
    while (local_30.super_SQObject._unVal = info_00,
          info_00.nInteger =
               SQTable::Next(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7,
                             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff98), -1 < info_00.nInteger) {
      if (local_40 == 0x8000010) {
        in_stack_ffffffffffffff98 = (SQObjectPtr *)(local_38 + 0x38);
        in_stack_ffffffffffffff90 =
             (NameShadowingChecker *)
             newSymbolInfo(in_stack_ffffffffffffff90,(SymbolKind)((ulong)in_RDI >> 0x20));
        declareSymbol(in_RSI,name,(SymbolInfo *)info_00.pTable);
      }
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)info_00.pTable);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)info_00.pTable);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)info_00.pTable);
  }
  return;
}

Assistant:

void NameShadowingChecker::loadBindings(const HSQOBJECT *bindings) {
  if (bindings && sq_istable(*bindings)) {
    SQTable *table = _table(*bindings);

    SQInteger idx = 0;
    SQObjectPtr pos(idx), key, val;

    while ((idx = table->Next(false, pos, key, val)) >= 0) {
      if (sq_isstring(key)) {
        const SQChar *s = _string(key)->_val;
        SymbolInfo *info = newSymbolInfo(SK_EXTERNAL_BINDING);
        declareSymbol(s, info);
      }
      pos._unVal.nInteger = idx;
    }
  }
}